

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O1

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  char *pcVar1;
  cmCTest *pcVar2;
  cmMakefile *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  string *psVar8;
  cmValue value;
  cmCTestGenericHandler *pcVar9;
  cmake *gname;
  ostream *poVar10;
  string *psVar11;
  char *pcVar12;
  char *pcVar13;
  string *option;
  pointer pbVar14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gg;
  string cmakeConfigureCommand;
  string cmakelists_file;
  cmList options;
  ostringstream e;
  undefined1 local_2b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  uint local_284;
  string local_280;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_228 [32];
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [24];
  _Manager_type local_1b8;
  _Invoker_type local_1b0;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  ios_base local_170 [264];
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  local_228._0_8_ = (pointer)0x0;
  local_228._8_8_ = (pointer)0x0;
  local_228._16_8_ = (pointer)0x0;
  if ((this->Options)._M_string_length != 0) {
    local_228._16_8_ = (pointer)0x0;
    local_228._0_8_ = (pointer)0x0;
    local_228._8_8_ = (pointer)0x0;
    cmList::Insert((container_type *)local_228,(const_iterator)0x0,&this->Options,Yes,No);
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"BuildDirectory","");
  cmCTest::GetCTestConfiguration((string *)local_1e0,pcVar2,&local_280);
  uVar4 = local_1e0._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,(ulong)(local_280.field_2._M_allocated_capacity + 1))
    ;
  }
  local_1e0._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_1d0;
  if ((undefined1 *)uVar4 == (undefined1 *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,"");
    cmCommand::SetError((cmCommand *)this,(string *)local_1e0);
LAB_0025e0b3:
    local_1f8._M_allocated_capacity = local_1d0._0_8_;
    local_208._0_8_ = local_1e0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0) {
LAB_0025e0c8:
      operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e0,"CTEST_CONFIGURE_COMMAND","");
    psVar8 = (string *)cmMakefile::GetDefinition(pcVar3,(string *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._0_8_ + 1);
    }
    if ((psVar8 != (string *)0x0) && (psVar8->_M_string_length != 0)) {
      if (psVar8 == (string *)0x0) {
        psVar8 = &cmValue::Empty_abi_cxx11_;
      }
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 psVar8,(this->super_cmCTestHandlerCommand).Quiet);
LAB_0025de45:
      pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_1e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"CTEST_LABELS_FOR_SUBPROJECTS","");
      value = cmMakefile::GetDefinition(pcVar3,(string *)local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0) {
        operator_delete((void *)local_1e0._0_8_,local_1d0._0_8_ + 1);
      }
      if (value.Value != (string *)0x0) {
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                   "LabelsForSubprojects",value.Value,(this->super_cmCTestHandlerCommand).Quiet);
      }
      pcVar9 = &cmCTest::GetConfigureHandler
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest)->
                super_cmCTestGenericHandler;
      (*((cmCTestGenericHandler *)&pcVar9->_vptr_cmCTestGenericHandler)->_vptr_cmCTestGenericHandler
        [3])(pcVar9);
      pcVar9->Quiet = (this->super_cmCTestHandlerCommand).Quiet;
      goto LAB_0025e0d3;
    }
    pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1e0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"CTEST_CMAKE_GENERATOR","");
    psVar8 = (string *)cmMakefile::GetDefinition(pcVar3,(string *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._0_8_ + 1);
    }
    if ((psVar8 == (string *)0x0) || (psVar8->_M_string_length == 0)) {
      local_1e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,"");
      cmCommand::SetError((cmCommand *)this,(string *)local_1e0);
      goto LAB_0025e0b3;
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_1e0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"SourceDirectory","");
    cmCTest::GetCTestConfiguration((string *)local_208,pcVar2,(string *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._0_8_ + 1);
    }
    if (local_208._8_8_ == 0) {
      local_1e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_1d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,"");
      cmCommand::SetError((cmCommand *)this,(string *)local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0) {
        operator_delete((void *)local_1e0._0_8_,local_1d0._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._0_8_ != &local_1f8) goto LAB_0025e0c8;
    }
    else {
      local_248._0_8_ = &local_238;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_248,local_208._0_8_,(char *)(local_208._0_8_ + local_208._8_8_));
      std::__cxx11::string::append(local_248);
      bVar5 = cmsys::SystemTools::FileExists((string *)local_248);
      if (bVar5) {
        gname = cmMakefile::GetCMakeInstance
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                           Makefile);
        if (psVar8 == (string *)0x0) {
          psVar8 = &cmValue::Empty_abi_cxx11_;
        }
        cmake::CreateGlobalGenerator((cmake *)local_2b0,(string *)gname,SUB81(psVar8,0));
        if ((pointer)local_2b0._0_8_ == (pointer)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                               *)local_2b0._0_8_)->
                            super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                            )._M_t.
                            super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                            .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl
                            [0x28]._vptr_cmGlobalGeneratorFactory)();
          uVar4 = local_2b0._0_8_;
          local_2b0._0_8_ = (pointer)0x0;
          if ((pointer)uVar4 != (pointer)0x0) {
            (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                         *)uVar4)->
                      super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                      )._M_t.
                      super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                      .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                      _vptr_cmGlobalGeneratorFactory)();
          }
        }
        psVar11 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        local_280.field_2._M_allocated_capacity = (long)&local_280.field_2 + 8;
        local_280._M_dataplus._M_p = (pointer)0x0;
        local_280._M_string_length = 1;
        local_280.field_2._M_local_buf[8] = '\"';
        local_1e0._0_8_ = &DAT_00000001;
        local_1d0._0_8_ = 0;
        local_1d0._16_8_ = (psVar11->_M_dataplus)._M_p;
        local_1d0._8_8_ = psVar11->_M_string_length;
        local_1b8 = (_Manager_type)0x0;
        local_1a8 = local_50;
        local_68 = 0;
        local_60 = 1;
        local_50[0] = 0x22;
        local_1b0 = (_Invoker_type)&DAT_00000001;
        local_1a0 = 0;
        views._M_len = 3;
        views._M_array = (iterator)local_1e0;
        local_1e0._8_8_ = local_280.field_2._M_allocated_capacity;
        local_58 = local_1a8;
        cmCatViews((string *)(local_2b0 + 8),views);
        uVar4 = local_228._8_8_;
        local_284 = uVar7;
        if (local_228._0_8_ == local_228._8_8_) {
          bVar6 = false;
        }
        else {
          bVar6 = false;
          pcVar1 = local_2b0 + 8;
          pbVar14 = (pointer)local_228._0_8_;
          local_1e8._M_p = (pointer)psVar8;
          do {
            std::__cxx11::string::append(pcVar1);
            std::__cxx11::string::_M_append(pcVar1,(ulong)(pbVar14->_M_dataplus)._M_p);
            std::__cxx11::string::append(pcVar1);
            pcVar13 = (pbVar14->_M_dataplus)._M_p;
            pcVar12 = strstr(pcVar13,"CMAKE_BUILD_TYPE=");
            if ((pcVar12 != (char *)0x0) ||
               (pcVar13 = strstr(pcVar13,"CMAKE_BUILD_TYPE:STRING="), pcVar13 != (char *)0x0)) {
              bVar6 = true;
            }
            pbVar14 = pbVar14 + 1;
            psVar8 = (string *)local_1e8._M_p;
          } while (pbVar14 != (pointer)uVar4);
        }
        if (((local_284 & 1) == 0 && !bVar6) &&
           (psVar11 = cmCTest::GetConfigType_abi_cxx11_
                                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest),
           psVar11->_M_string_length != 0)) {
          std::__cxx11::string::append(local_2b0 + 8);
          psVar11 = cmCTest::GetConfigType_abi_cxx11_
                              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
          std::__cxx11::string::_M_append(local_2b0 + 8,(ulong)(psVar11->_M_dataplus)._M_p);
          std::__cxx11::string::append(local_2b0 + 8);
        }
        pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_1e0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e0,"CTEST_USE_LAUNCHERS","");
        bVar6 = cmMakefile::IsOn(pcVar3,(string *)local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0) {
          operator_delete((void *)local_1e0._0_8_,local_1d0._0_8_ + 1);
        }
        if (bVar6) {
          std::__cxx11::string::append(local_2b0 + 8);
        }
        std::__cxx11::string::append(local_2b0 + 8);
        std::__cxx11::string::_M_append(local_2b0 + 8,(ulong)(psVar8->_M_dataplus)._M_p);
        std::__cxx11::string::append(local_2b0 + 8);
        pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_1e0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e0,"CTEST_CMAKE_GENERATOR_PLATFORM","");
        psVar8 = (string *)cmMakefile::GetDefinition(pcVar3,(string *)local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0) {
          operator_delete((void *)local_1e0._0_8_,local_1d0._0_8_ + 1);
        }
        if ((psVar8 != (string *)0x0) && (psVar8->_M_string_length != 0)) {
          std::__cxx11::string::append(local_2b0 + 8);
          if (psVar8 == (string *)0x0) {
            psVar8 = &cmValue::Empty_abi_cxx11_;
          }
          std::__cxx11::string::_M_append(local_2b0 + 8,(ulong)(psVar8->_M_dataplus)._M_p);
          std::__cxx11::string::append(local_2b0 + 8);
        }
        pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        local_1e0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e0,"CTEST_CMAKE_GENERATOR_TOOLSET","");
        psVar8 = (string *)cmMakefile::GetDefinition(pcVar3,(string *)local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0) {
          operator_delete((void *)local_1e0._0_8_,local_1d0._0_8_ + 1);
        }
        if ((psVar8 != (string *)0x0) && (psVar8->_M_string_length != 0)) {
          std::__cxx11::string::append(local_2b0 + 8);
          if (psVar8 == (string *)0x0) {
            psVar8 = &cmValue::Empty_abi_cxx11_;
          }
          std::__cxx11::string::_M_append(local_2b0 + 8,(ulong)(psVar8->_M_dataplus)._M_p);
          std::__cxx11::string::append(local_2b0 + 8);
        }
        std::__cxx11::string::append(local_2b0 + 8);
        std::__cxx11::string::_M_append(local_2b0 + 8,local_208._0_8_);
        std::__cxx11::string::append(local_2b0 + 8);
        std::__cxx11::string::append(local_2b0 + 8);
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"BuildDirectory","");
        cmCTest::GetCTestConfiguration((string *)local_1e0,pcVar2,&local_280);
        std::__cxx11::string::_M_append(local_2b0 + 8,local_1e0._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0) {
          operator_delete((void *)local_1e0._0_8_,local_1d0._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          (ulong)(local_280.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::string::append(local_2b0 + 8);
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand"
                   ,(string *)(local_2b0 + 8),(this->super_cmCTestHandlerCommand).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._8_8_ != &local_298) {
          operator_delete((void *)local_2b0._8_8_,local_298._M_allocated_capacity + 1);
        }
        if ((pointer)local_2b0._0_8_ != (pointer)0x0) {
          (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                       *)local_2b0._0_8_)->
                    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                    )._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                    _vptr_cmGlobalGeneratorFactory)();
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e0,"CMakeLists.txt file does not exist [",0x24);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e0,(char *)local_248._0_8_,local_248._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError((cmCommand *)this,&local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,
                          (ulong)(local_280.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
        std::ios_base::~ios_base(local_170);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._0_8_ != &local_238) {
        operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._0_8_ != &local_1f8) {
        operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
      }
      if (bVar5) goto LAB_0025de45;
    }
  }
  pcVar9 = (cmCTestGenericHandler *)0x0;
LAB_0025e0d3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_228);
  return pcVar9;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  cmList options;

  if (!this->Options.empty()) {
    options.assign(this->Options);
  }

  if (this->CTest->GetCTestConfiguration("BuildDirectory").empty()) {
    this->SetError(
      "Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return nullptr;
  }

  cmValue ctestConfigureCommand =
    this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if (cmNonempty(ctestConfigureCommand)) {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
                                       *ctestConfigureCommand, this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if (cmNonempty(cmakeGeneratorName)) {
      const std::string& source_dir =
        this->CTest->GetCTestConfiguration("SourceDirectory");
      if (source_dir.empty()) {
        this->SetError(
          "Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return nullptr;
      }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if (!cmSystemTools::FileExists(cmakelists_file)) {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist [" << cmakelists_file << "]";
        this->SetError(e.str());
        return nullptr;
      }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      auto gg = this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
        *cmakeGeneratorName);
      if (gg) {
        multiConfig = gg->IsMultiConfig();
        gg.reset();
      }

      std::string cmakeConfigureCommand =
        cmStrCat('"', cmSystemTools::GetCMakeCommand(), '"');

      for (std::string const& option : options) {
        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
            (nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING="))) {
          cmakeBuildTypeInOptions = true;
        }
      }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty()) {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
      }

      if (this->Makefile->IsOn("CTEST_USE_LAUNCHERS")) {
        cmakeConfigureCommand += " \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"";
      }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += *cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      cmValue cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if (cmNonempty(cmakeGeneratorPlatform)) {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += *cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
      }

      cmValue cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if (cmNonempty(cmakeGeneratorToolset)) {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += *cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
      }

      cmakeConfigureCommand += " \"-S";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      cmakeConfigureCommand += " \"-B";
      cmakeConfigureCommand +=
        this->CTest->GetCTestConfiguration("BuildDirectory");
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration("ConfigureCommand",
                                         cmakeConfigureCommand, this->Quiet);
    } else {
      this->SetError(
        "Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return nullptr;
    }
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  cmCTestConfigureHandler* handler = this->CTest->GetConfigureHandler();
  handler->Initialize();
  handler->SetQuiet(this->Quiet);
  return handler;
}